

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_resize_filter_arena(Parser *this,size_t num_characters)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  undefined8 uVar4;
  ulong in_RSI;
  long in_RDI;
  char msg [39];
  char *prev;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  Location *in_stack_ffffffffffffff70;
  undefined1 local_48 [48];
  undefined8 local_18;
  ulong local_10;
  
  if (*(ulong *)(in_RDI + 0xa80) < in_RSI) {
    local_18 = *(undefined8 *)(in_RDI + 0xa78);
    local_10 = in_RSI;
    if (*(long *)(in_RDI + 0xa78) != 0) {
      if (*(long *)(in_RDI + 0xa80) == 0) {
        memcpy(local_48,"check failed: (m_filter_arena.len > 0)",0x27);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x9e8);
        Location::Location(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        (*pcVar1)(local_48,0x27,*(undefined8 *)(in_RDI + 0x9d0));
      }
      (**(code **)(in_RDI + 0x9e0))
                (*(undefined8 *)(in_RDI + 0xa78),*(undefined8 *)(in_RDI + 0xa80),
                 *(undefined8 *)(in_RDI + 0x9d0));
      *(undefined8 *)(in_RDI + 0xa78) = 0;
    }
    uVar4 = (**(code **)(in_RDI + 0x9d8))(local_10,local_18,*(undefined8 *)(in_RDI + 0x9d0));
    *(undefined8 *)(in_RDI + 0xa78) = uVar4;
    *(ulong *)(in_RDI + 0xa80) = local_10;
  }
  return;
}

Assistant:

void Parser::_resize_filter_arena(size_t num_characters)
{
    if(num_characters > m_filter_arena.len)
    {
        _c4dbgpf("resize: sz={}", num_characters);
        char *prev = m_filter_arena.str;
        if(m_filter_arena.str)
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_filter_arena.len > 0);
            _RYML_CB_FREE(m_stack.m_callbacks, m_filter_arena.str, char, m_filter_arena.len);
        }
        m_filter_arena.str = _RYML_CB_ALLOC_HINT(m_stack.m_callbacks, char, num_characters, prev);
        m_filter_arena.len = num_characters;
    }
}